

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactnns.h
# Opt level: O0

void __thiscall ExactNNS<float,_KBalls<float>_>::writeResult(ExactNNS<float,_KBalls<float>_> *this)

{
  byte bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference this_00;
  size_type sVar4;
  DistData<int> *pDVar5;
  int *piVar6;
  float fVar7;
  DistData<int> local_288;
  DistDataMax<int> kDist_1;
  DistData<int> DStack_278;
  int i;
  DistDataMax<int> kDist;
  vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_> tempList;
  priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>
  *maxHeap;
  long lStack_248;
  int query_id;
  ofstream lshboxFout;
  allocator local_31;
  string local_30 [8];
  string lshboxBenchFileName;
  ExactNNS<float,_KBalls<float>_> *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"logs/nn.lshbox",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::ofstream::ofstream(&stack0xfffffffffffffdb8,local_30,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)&stack0xfffffffffffffdb8 + *(long *)(lStack_248 + -0x18)
                                     ));
  if ((bVar1 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"cannot create output file ");
    poVar3 = std::operator<<(poVar3,local_30);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  sVar2 = std::
          vector<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
          ::size(&this->maxHeaps_);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&stack0xfffffffffffffdb8,sVar2);
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->topK_);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (maxHeap._4_4_ = 0;
      sVar2 = std::
              vector<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
              ::size(&this->maxHeaps_), (ulong)(long)maxHeap._4_4_ < sVar2;
      maxHeap._4_4_ = maxHeap._4_4_ + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&stack0xfffffffffffffdb8,maxHeap._4_4_);
    std::operator<<(poVar3,"\t");
    this_00 = std::
              vector<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
              ::operator[](&this->maxHeaps_,(long)maxHeap._4_4_);
    std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>::vector
              ((vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_> *)&kDist);
    while (sVar4 = std::
                   priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>
                   ::size(this_00), sVar4 != 0) {
      pDVar5 = &std::
                priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>
                ::top(this_00)->super_DistData<int>;
      DStack_278 = *pDVar5;
      std::
      priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>
      ::pop(this_00);
      std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>::push_back
                ((vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_> *)&kDist,
                 (value_type *)&stack0xfffffffffffffd88);
    }
    sVar2 = std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>::size
                      ((vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_> *)&kDist);
    kDist_1.super_DistData<int>.data_ = (int)sVar2;
    while (kDist_1.super_DistData<int>.data_ = kDist_1.super_DistData<int>.data_ + -1,
          -1 < kDist_1.super_DistData<int>.data_) {
      pDVar5 = &std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>::operator[]
                          ((vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_> *)&kDist,
                           (long)kDist_1.super_DistData<int>.data_)->super_DistData<int>;
      local_288 = *pDVar5;
      piVar6 = DistData<int>::data(&local_288);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&stack0xfffffffffffffdb8,*piVar6);
      poVar3 = std::operator<<(poVar3,"\t");
      fVar7 = DistData<int>::dist(&local_288);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar7);
      std::operator<<(poVar3,"\t");
    }
    std::ostream::operator<<
              ((ostream *)&stack0xfffffffffffffdb8,std::endl<char,std::char_traits<char>>);
    std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>::~vector
              ((vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_> *)&kDist);
  }
  std::ofstream::close();
  poVar3 = std::operator<<((ostream *)&std::cout,"lshbox groundtruth are written into ");
  poVar3 = std::operator<<(poVar3,local_30);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(&stack0xfffffffffffffdb8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void ExactNNS<DataType, KMeansType>::writeResult() {
    string lshboxBenchFileName = "logs/nn.lshbox";
    // lshbox file
    ofstream lshboxFout(lshboxBenchFileName);
    if (!lshboxFout) {
        cout << "cannot create output file " << lshboxBenchFileName << endl;
    }
    lshboxFout << maxHeaps_.size() << "\t" << topK_ << endl;
    for (int query_id = 0; query_id < maxHeaps_.size(); ++query_id) {
        lshboxFout << query_id << "\t";
        priority_queue<DistDataMax<int > >& maxHeap = maxHeaps_[query_id];

        vector<DistDataMax<int> > tempList;
        while (maxHeap.size()>0) {
            DistDataMax<int> kDist = maxHeap.top();
            maxHeap.pop();
            tempList.push_back(kDist);
        }
        for (int i = tempList.size()-1; i >=0 ; --i) {
            DistDataMax<int> kDist = tempList[i];
            lshboxFout << kDist.data() << "\t" << kDist.dist() << "\t";
        }

        lshboxFout << endl;
    }
    lshboxFout.close();
    cout << "lshbox groundtruth are written into " << lshboxBenchFileName << endl;
}